

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void snapshot_stats_test(void)

{
  fdb_status fVar1;
  size_t metalen;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffffa58;
  fdb_file_handle *in_stack_fffffffffffffa60;
  fdb_doc **in_stack_fffffffffffffa68;
  size_t in_stack_fffffffffffffa80;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_kvs_info kvs_info;
  fdb_doc **doc;
  fdb_seqnum_t snap_seq;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fVar1 = fdb_open((fdb_file_handle **)bodybuf._72_8_,(char *)bodybuf._64_8_,
                   (fdb_config *)bodybuf._56_8_);
  fdb_kvs_open_default
            (in_stack_fffffffffffffa60,(fdb_kvs_handle **)in_stack_fffffffffffffa58,
             (fdb_kvs_config *)0x1077ba);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2a7);
    snapshot_stats_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2a7,"void snapshot_stats_test()");
    }
  }
  for (n = 0; n < 0x14; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x1078ed;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                   (size_t)in_stack_fffffffffffffa58,meta,metalen,(void *)0x107924,
                   in_stack_fffffffffffffa80);
    fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffffa58 + (long)n * 8));
    fdb_doc_free((fdb_doc *)0x107954);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffa58,'\0');
  fVar1 = fdb_get_kvs_info((fdb_kvs_handle *)fconfig._128_8_,
                           (fdb_kvs_info *)fconfig.num_compactor_threads);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2ba);
    snapshot_stats_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2ba,"void snapshot_stats_test()");
    }
  }
  fVar1 = fdb_set_log_callback(snap_db,logCallbackFunc,"snapshot_stats_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2bf);
    snapshot_stats_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2bf,"void snapshot_stats_test()");
    }
  }
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)bodybuf._208_8_,(fdb_kvs_handle **)bodybuf._200_8_,
                            bodybuf._192_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2c3);
    snapshot_stats_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2c3,"void snapshot_stats_test()");
    }
  }
  fdb_get_kvs_info((fdb_kvs_handle *)fconfig._128_8_,(fdb_kvs_info *)fconfig.num_compactor_threads);
  if (kvs_info.last_seqnum != 0x14) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2c9);
    snapshot_stats_test::__test_pass = 0;
    if (kvs_info.last_seqnum != 0x14) {
      __assert_fail("kvs_info.doc_count == (size_t)n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2c9,"void snapshot_stats_test()");
    }
  }
  if ((fdb_kvs_handle *)kvs_info.space_used != db) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2ca);
    snapshot_stats_test::__test_pass = 0;
    if ((fdb_kvs_handle *)kvs_info.space_used != db) {
      __assert_fail("kvs_info.file == dbfile",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2ca,"void snapshot_stats_test()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffffa58);
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)bodybuf._208_8_,(fdb_kvs_handle **)bodybuf._200_8_,
                            bodybuf._192_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2d1);
    snapshot_stats_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2d1,"void snapshot_stats_test()");
    }
  }
  fdb_get_kvs_info((fdb_kvs_handle *)fconfig._128_8_,(fdb_kvs_info *)fconfig.num_compactor_threads);
  if (kvs_info.last_seqnum != 0x14) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2d7);
    snapshot_stats_test::__test_pass = 0;
    if (kvs_info.last_seqnum != 0x14) {
      __assert_fail("kvs_info.doc_count == (size_t)n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2d7,"void snapshot_stats_test()");
    }
  }
  if ((fdb_kvs_handle *)kvs_info.space_used != db) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x2d8);
    snapshot_stats_test::__test_pass = 0;
    if ((fdb_kvs_handle *)kvs_info.space_used != db) {
      __assert_fail("kvs_info.file == dbfile",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x2d8,"void snapshot_stats_test()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffffa58);
  fdb_kvs_close(in_stack_fffffffffffffa58);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffa58);
  fdb_shutdown();
  memleak_end();
  if (snapshot_stats_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","snapshot stats test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","snapshot stats test");
  }
  return;
}

Assistant:

void snapshot_stats_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_seqnum_t snap_seq;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info kvs_info;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // ------- Setup test ----------------------------------
    // insert documents
    for (i=0; i<n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // retrieve the sequence number for a snapshot open
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    snap_seq = kvs_info.last_seqnum;

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "snapshot_stats_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Init Snapshot of open file with saved document seqnum as marker
    status = fdb_snapshot_open(db, &snap_db, snap_seq);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    TEST_CHK(kvs_info.doc_count == (size_t)n);
    TEST_CHK(kvs_info.file == dbfile);

    // close snapshot handle
    fdb_kvs_close(snap_db);

    // Test stats by creating an in-memory snapshot
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    TEST_CHK(kvs_info.doc_count == (size_t)n);
    TEST_CHK(kvs_info.file == dbfile);

    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db handle
    fdb_kvs_close(db);
    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("snapshot stats test");
}